

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

string * __thiscall front::syntax::SyntaxAnalyze::hp_gen_save_value_abi_cxx11_(SyntaxAnalyze *this)

{
  char *in_RSI;
  string *in_RDI;
  string *name;
  string *__lhs;
  string local_a8 [8];
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_68 [32];
  string local_48 [54];
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
             (allocator<char> *)in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_12);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60);
  std::__cxx11::to_string(in_stack_ffffffffffffff6c);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(__lhs,in_RSI);
  std::__cxx11::string::operator=((string *)__lhs,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  *(int *)(in_RSI + 0x14) = *(int *)(in_RSI + 0x14) + 1;
  return in_RDI;
}

Assistant:

string SyntaxAnalyze::hp_gen_save_value() {
  string name = "$$";
  name = name + "__Compiler__gen__save__value__" + to_string(_genValueNum) +
         "__$$";
  _genValueNum++;
  return name;
}